

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_seed_tree(REF_INTERP ref_interp)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_NODE pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  ulong uVar7;
  void *my_array;
  void *my_array_00;
  long lVar8;
  void *pvVar9;
  REF_INT *pRVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 *puVar14;
  void *pvVar15;
  REF_INT RVar16;
  long lVar17;
  REF_MPI pRVar18;
  int iVar19;
  char *pcVar20;
  REF_SEARCH pRVar21;
  size_t sVar22;
  uint uVar23;
  double dVar24;
  REF_DBL RVar25;
  REF_INT total_node;
  REF_MPI local_178;
  REF_INT *local_170;
  void *local_168;
  REF_DBL *local_160;
  REF_INT *local_158;
  REF_SEARCH local_150;
  REF_INT *source;
  REF_DBL *global_xyz;
  REF_LIST ref_list;
  void *local_130;
  void *local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  uint local_108;
  REF_INT nrecv;
  REF_DBL *recv_bary;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  REF_NODE local_d8;
  REF_CELL local_d0;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  pRVar18 = ref_interp->ref_mpi;
  pRVar1 = ref_interp->from_grid->node;
  pRVar2 = ref_interp->from_tet;
  pRVar3 = ref_interp->to_grid->node;
  pRVar21 = ref_interp->ref_search;
  uVar5 = ref_list_create(&ref_list);
  if (uVar5 == 0) {
    uVar5 = pRVar3->max;
    uVar7 = 0;
    uVar11 = 0;
    if (0 < (int)uVar5) {
      uVar11 = (ulong)uVar5;
    }
    uVar23 = 0;
    for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
      if ((-1 < pRVar3->global[uVar7]) && (pRVar3->ref_mpi->id == pRVar3->part[uVar7])) {
        uVar23 = uVar23 + (ref_interp->cell[uVar7] == -1);
      }
    }
    local_150 = pRVar21;
    local_d0 = pRVar2;
    if ((int)uVar23 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x617,"ref_interp_seed_tree","malloc local_node of REF_INT negative");
      return 1;
    }
    local_d8 = pRVar1;
    my_array = malloc((ulong)uVar23 << 2);
    if (my_array == (void *)0x0) {
      pcVar20 = "malloc local_node of REF_INT NULL";
      uVar13 = 0x617;
    }
    else {
      my_array_00 = malloc((ulong)(uVar23 * 3) << 3);
      if (my_array_00 == (void *)0x0) {
        pcVar20 = "malloc local_xyz of REF_DBL NULL";
        uVar13 = 0x618;
      }
      else {
        lVar12 = 8;
        uVar23 = 0;
        for (lVar8 = 0; lVar8 < (int)uVar5; lVar8 = lVar8 + 1) {
          if (((-1 < pRVar3->global[lVar8]) && (pRVar3->ref_mpi->id == pRVar3->part[lVar8])) &&
             (ref_interp->cell[lVar8] == -1)) {
            *(int *)((long)my_array + (long)(int)uVar23 * 4) = (int)lVar8;
            pRVar4 = pRVar3->real;
            lVar17 = (long)(int)(uVar23 * 3);
            *(undefined8 *)((long)my_array_00 + lVar17 * 8) =
                 *(undefined8 *)((long)pRVar4 + lVar12 * 2 + -0x10);
            *(undefined8 *)((long)my_array_00 + lVar17 * 8 + 8) =
                 *(undefined8 *)((long)pRVar4 + lVar12 * 2 + -8);
            *(undefined8 *)((long)my_array_00 + lVar17 * 8 + 0x10) =
                 *(undefined8 *)((long)pRVar4 + lVar12 * 2);
            uVar23 = uVar23 + 1;
          }
          lVar12 = lVar12 + 0x3c;
        }
        if (0 < (int)uVar23) {
          lVar12 = 0;
          uVar5 = 10;
          if (10 < uVar23 / 100) {
            uVar5 = uVar23 / 100;
          }
          if (uVar23 <= uVar5) {
            uVar5 = uVar23;
          }
          uVar7 = (ulong)uVar5;
          if (99 < uVar5) {
            uVar7 = 100;
          }
          puVar14 = (undefined8 *)((long)my_array_00 + 0x10);
          lVar8 = 0;
          for (; (int)lVar12 < (int)uVar23; lVar12 = lVar12 + (ulong)((int)(uVar23 / uVar7) + 1)) {
            *(undefined4 *)((long)my_array + lVar8 * 4) =
                 *(undefined4 *)((long)my_array + lVar12 * 4);
            lVar17 = lVar12 * 0x18;
            puVar14[-2] = *(undefined8 *)((long)my_array_00 + lVar17);
            puVar14[-1] = *(undefined8 *)((long)my_array_00 + lVar17 + 8);
            *puVar14 = *(undefined8 *)((long)my_array_00 + lVar17 + 0x10);
            lVar8 = lVar8 + 1;
            puVar14 = puVar14 + 3;
          }
          uVar23 = (uint)lVar8;
        }
        local_178 = pRVar18;
        uVar5 = ref_mpi_allconcat(pRVar18,3,uVar23,my_array_00,&total_node,&source,&global_xyz,3);
        if (uVar5 != 0) {
          pcVar20 = "cat";
          uVar13 = 0x639;
          goto LAB_001655b8;
        }
        free(source);
        uVar5 = ref_mpi_allconcat(pRVar18,1,uVar23,my_array,&total_node,&source,&global_node,1);
        if (uVar5 != 0) {
          pcVar20 = "cat";
          uVar13 = 0x63d;
LAB_001658aa:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar13,"ref_interp_seed_tree",(ulong)uVar5,pcVar20);
          return uVar5;
        }
        lVar12 = (long)total_node;
        if (lVar12 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x63f,"ref_interp_seed_tree","malloc best_bary of REF_DBL negative");
          return 1;
        }
        local_160 = (REF_DBL *)malloc(lVar12 * 8);
        if (local_160 == (REF_DBL *)0x0) {
          pcVar20 = "malloc best_bary of REF_DBL NULL";
          uVar13 = 0x63f;
        }
        else {
          sVar22 = lVar12 << 2;
          local_110 = malloc(sVar22);
          if (local_110 == (void *)0x0) {
            pcVar20 = "malloc best_node of REF_INT NULL";
            uVar13 = 0x640;
          }
          else {
            pvVar9 = malloc(sVar22);
            if (pvVar9 == (void *)0x0) {
              pcVar20 = "malloc best_cell of REF_INT NULL";
              uVar13 = 0x641;
            }
            else {
              pRVar10 = (REF_INT *)malloc(sVar22);
              if (pRVar10 != (REF_INT *)0x0) {
                lVar8 = 0;
                lVar12 = 0;
                pvVar15 = (void *)0x0;
                local_158 = pRVar10;
                local_118 = pvVar9;
                do {
                  pvVar9 = local_118;
                  if ((long)total_node <= (long)pvVar15) {
                    uVar5 = ref_mpi_allminwho(local_178,local_160,local_158,total_node);
                    RVar16 = total_node;
                    if (uVar5 == 0) {
                      uVar7 = 0;
                      uVar11 = 0;
                      if (0 < total_node) {
                        uVar11 = (ulong)(uint)total_node;
                      }
                      uVar5 = 0;
                      for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
                        uVar5 = uVar5 + (local_178->id == local_158[uVar7]);
                      }
                      local_120 = malloc((ulong)(uVar5 * 4) << 3);
                      if (local_120 == (void *)0x0) {
                        pcVar20 = "malloc send_bary of REF_DBL NULL";
                        uVar13 = 0x661;
                        goto LAB_0016582b;
                      }
                      sVar22 = (ulong)uVar5 * 4;
                      local_168 = malloc(sVar22);
                      if (local_168 == (void *)0x0) {
                        pcVar20 = "malloc send_cell of REF_INT NULL";
                        uVar13 = 0x662;
                        goto LAB_0016582b;
                      }
                      local_128 = malloc(sVar22);
                      if (local_128 == (void *)0x0) {
                        pcVar20 = "malloc send_node of REF_INT NULL";
                        uVar13 = 0x663;
                        goto LAB_0016582b;
                      }
                      local_170 = (REF_INT *)malloc(sVar22);
                      if (local_170 == (REF_INT *)0x0) {
                        pcVar20 = "malloc send_proc of REF_INT NULL";
                        uVar13 = 0x664;
                        goto LAB_0016582b;
                      }
                      local_130 = malloc(sVar22);
                      if (local_130 == (void *)0x0) {
                        pcVar20 = "malloc my_proc of REF_INT NULL";
                        uVar13 = 0x665;
                        local_130 = (void *)0x0;
                        goto LAB_0016582b;
                      }
                      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
                        *(REF_INT *)((long)local_130 + uVar7 * 4) = local_178->id;
                      }
                      pRVar21 = (REF_SEARCH)0x0;
                      iVar19 = 0;
                      pRVar18 = local_178;
                      for (lVar12 = 0; lVar12 < RVar16; lVar12 = lVar12 + 1) {
                        if (pRVar18->id == local_158[lVar12]) {
                          lVar8 = (long)iVar19;
                          local_170[lVar8] = source[lVar12];
                          local_108 = *(uint *)((long)local_110 + lVar12 * 4);
                          *(uint *)((long)local_128 + lVar8 * 4) = local_108;
                          uVar5 = *(uint *)((long)local_118 + lVar12 * 4);
                          *(uint *)((long)local_168 + lVar8 * 4) = uVar5;
                          if (uVar5 != 0xffffffff) {
                            local_150 = pRVar21;
                            uVar23 = ref_cell_nodes(local_d0,uVar5,nodes);
                            if (uVar23 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x671,"ref_interp_seed_tree",(ulong)uVar23,
                                     "cell should be set and valid");
                              printf("global %d best cell %d best bary %e\n",local_160[lVar12],
                                     (ulong)local_108,(ulong)uVar5);
                              return uVar23;
                            }
                            uVar5 = ref_node_bary4(local_d8,nodes,
                                                   (REF_DBL *)((long)global_xyz + (long)local_150),
                                                   (REF_DBL *)
                                                   ((long)local_120 + (long)(iVar19 * 4) * 8));
                            pRVar21 = local_150;
                            RVar16 = total_node;
                            if (uVar5 != 0) {
                              uVar7 = (ulong)uVar5;
                              pcVar20 = "bary";
                              uVar13 = 0x674;
                              goto LAB_001655bd;
                            }
                          }
                          iVar19 = iVar19 + 1;
                          pRVar18 = local_178;
                        }
                        pRVar21 = (REF_SEARCH)&pRVar21->left;
                      }
                      uVar5 = ref_mpi_blindsend(pRVar18,local_170,local_128,1,iVar19,&recv_node,
                                                &nrecv,1);
                      if (uVar5 == 0) {
                        uVar5 = ref_mpi_blindsend(local_178,local_170,local_168,1,iVar19,&recv_cell,
                                                  &nrecv,1);
                        if (uVar5 == 0) {
                          uVar5 = ref_mpi_blindsend(local_178,local_170,local_130,1,iVar19,
                                                    &recv_proc,&nrecv,1);
                          if (uVar5 != 0) {
                            pcVar20 = "blind send proc";
                            uVar13 = 0x681;
LAB_0016600c:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,uVar13,"ref_interp_seed_tree",(ulong)uVar5,pcVar20);
                            return uVar5;
                          }
                          uVar5 = ref_mpi_blindsend(local_178,local_170,local_120,4,iVar19,
                                                    &recv_bary,&nrecv,3);
                          if (uVar5 != 0) {
                            pcVar20 = "blind send bary";
                            uVar13 = 0x684;
                            goto LAB_0016600c;
                          }
                          lVar8 = 0;
                          for (lVar12 = 0; lVar12 < nrecv; lVar12 = lVar12 + 1) {
                            ref_interp->n_tree = ref_interp->n_tree + 1;
                            iVar19 = recv_node[lVar12];
                            pRVar10 = ref_interp->cell;
                            if ((long)pRVar10[iVar19] != -1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x689,"ref_interp_seed_tree","tree already found?",
                                     0xffffffffffffffff,(long)pRVar10[iVar19]);
                              return 1;
                            }
                            if (ref_interp->agent_hired[iVar19] != 0) {
                              uVar5 = ref_agents_delete(ref_interp->ref_agents,iVar19);
                              if (uVar5 != 0) {
                                uVar7 = (ulong)uVar5;
                                pcVar20 = "deq";
                                uVar13 = 0x68b;
                                goto LAB_001655bd;
                              }
                              ref_interp->agent_hired[iVar19] = 0;
                              pRVar10 = ref_interp->cell;
                            }
                            pRVar10[iVar19] = recv_cell[lVar12];
                            ref_interp->part[iVar19] = recv_proc[lVar12];
                            if (recv_cell[lVar12] == -1) {
                              ref_interp->n_tree = ref_interp->n_tree + -1;
                            }
                            else {
                              pRVar4 = ref_interp->bary;
                              for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
                                pRVar4[iVar19 * 4 + lVar17] =
                                     *(REF_DBL *)((long)recv_bary + lVar17 * 8 + lVar8);
                              }
                              uVar5 = ref_interp_push_onto_queue(ref_interp,iVar19);
                              if (uVar5 != 0) {
                                pcVar20 = "queue neighbors";
                                uVar13 = 0x693;
                                goto LAB_001658aa;
                              }
                            }
                            lVar8 = lVar8 + 0x20;
                          }
                          free(recv_node);
                          free(recv_cell);
                          free(recv_proc);
                          free(recv_bary);
                          free(local_120);
                          free(local_130);
                          free(local_168);
                          free(local_128);
                          free(local_170);
                          free(local_158);
                          free(local_118);
                          free(local_110);
                          free(local_160);
                          free(source);
                          free(global_node);
                          free(global_xyz);
                          free(my_array_00);
                          free(my_array);
                          uVar5 = ref_list_free(ref_list);
                          if (uVar5 == 0) {
                            return 0;
                          }
                          pcVar20 = "free list";
                          uVar13 = 0x6af;
                          uVar7 = (ulong)uVar5;
                        }
                        else {
                          uVar7 = (ulong)uVar5;
                          pcVar20 = "blind send cell";
                          uVar13 = 0x67e;
                        }
                      }
                      else {
                        uVar7 = (ulong)uVar5;
                        pcVar20 = "blind send node";
                        uVar13 = 0x67b;
                      }
                      goto LAB_001655bd;
                    }
                    pcVar20 = "who";
                    uVar13 = 0x65b;
                    goto LAB_001655b8;
                  }
                  *(undefined4 *)((long)local_110 + lVar12) =
                       *(undefined4 *)((long)global_node + lVar12);
                  *(undefined4 *)((long)local_118 + lVar12) = 0xffffffff;
                  *(undefined8 *)((long)local_160 + lVar12 * 2) = 0x4415af1d78b58c40;
                  local_168 = pvVar15;
                  uVar5 = ref_search_touching(local_150,ref_list,
                                              (REF_DBL *)((long)global_xyz + lVar8),
                                              ref_interp->search_fuzz);
                  if (uVar5 != 0) {
                    pcVar20 = "tch";
                    uVar13 = 0x649;
                    goto LAB_001655b8;
                  }
                  pRVar10 = (REF_INT *)((long)pvVar9 + lVar12);
                  if (ref_list->n < 1) {
                    *pRVar10 = -1;
                    goto LAB_00165a1a;
                  }
                  uVar5 = ref_interp_enclosing_tet_in_list
                                    (ref_interp,ref_list,(REF_DBL *)((long)global_xyz + lVar8),
                                     pRVar10,bary);
                  if (uVar5 != 0) {
                    pcVar20 = "best in list";
                    uVar13 = 0x64e;
                    goto LAB_001655b8;
                  }
                  if (*pRVar10 != -1) {
                    dVar24 = bary[0];
                    if (bary[1] <= bary[0]) {
                      dVar24 = bary[1];
                    }
                    RVar25 = bary[2];
                    if (bary[3] <= bary[2]) {
                      RVar25 = bary[3];
                    }
                    if (RVar25 <= dVar24) {
                      dVar24 = RVar25;
                    }
                    *(double *)((long)local_160 + lVar12 * 2) = -dVar24;
                  }
LAB_00165a1a:
                  ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
                  uVar5 = ref_list_erase(ref_list);
                  pvVar15 = (void *)((long)local_168 + 1);
                  lVar12 = lVar12 + 4;
                  lVar8 = lVar8 + 0x18;
                } while (uVar5 == 0);
                pcVar20 = "reset list";
                uVar13 = 0x657;
                goto LAB_001655b8;
              }
              pcVar20 = "malloc from_proc of REF_INT NULL";
              uVar13 = 0x642;
            }
          }
        }
      }
    }
LAB_0016582b:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13
           ,"ref_interp_seed_tree",pcVar20);
    RVar6 = 2;
  }
  else {
    pcVar20 = "create list";
    uVar13 = 0x60f;
LAB_001655b8:
    uVar7 = (ulong)uVar5;
LAB_001655bd:
    RVar6 = (REF_STATUS)uVar7;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13
           ,"ref_interp_seed_tree",uVar7,pcVar20);
  }
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_seed_tree(REF_INTERP ref_interp) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_SEARCH ref_search = ref_interp_search(ref_interp);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget, seed_target, stride;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }

  /* use approximately 1 percent of existing targets sampled uniformly,
     between 10 or 100, less than or equal ntarget */
  seed_target = ntarget / 100;
  seed_target = MAX(seed_target, 10);
  seed_target = MIN(seed_target, 100);
  seed_target = MIN(seed_target, ntarget);
  if (seed_target > 0) {
    stride = 1 + ntarget / seed_target;
    seed_target = 0;
    for (node = 0; node < ntarget; node += stride) {
      local_node[seed_target] = local_node[node];
      local_xyz[0 + 3 * seed_target] = local_xyz[0 + 3 * node];
      local_xyz[1 + 3 * seed_target] = local_xyz[1 + 3 * node];
      local_xyz[2 + 3 * seed_target] = local_xyz[2 + 3 * node];
      seed_target++;
    }
    ntarget = seed_target;
  }

  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use max*/
    RSS(ref_search_touching(ref_search, ref_list, &(global_xyz[3 * node]),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      RSS(ref_interp_enclosing_tet_in_list(ref_interp, ref_list,
                                           &(global_xyz[3 * node]),
                                           &(best_cell[node]), bary),
          "best in list");
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use max*/
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_tet, best_cell[node], nodes),
            "cell should be set and valid", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                           &(send_bary[4 * nsend])),
            "bary");
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
      RSS(ref_interp_push_onto_queue(ref_interp, node), "queue neighbors");
    } else {
      (ref_interp->n_tree)--;
    }
  }

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  return REF_SUCCESS;
}